

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O3

void test_parse_cold_140(void)

{
  FILE *__stream;
  uint uVar1;
  milo_value *in_RDI;
  
  __stream = _stderr;
  uVar1 = milo_parse(in_RDI,"\"\\u0\"");
  fprintf(__stream,"%s:%d: expect: %d actual: %d\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/KevinOfNeu[P]Milo/test.c",0x127,8,
          (ulong)uVar1);
  main_ret = 1;
  return;
}

Assistant:

static void test_parse_invalid_unicode_hex() {
    TEST_ERROR(MILO_PARSE_INVALID_UNICODE_HEX, "\"\\u\"");
    TEST_ERROR(MILO_PARSE_INVALID_UNICODE_HEX, "\"\\u0\"");
    TEST_ERROR(MILO_PARSE_INVALID_UNICODE_HEX, "\"\\u01\"");
    TEST_ERROR(MILO_PARSE_INVALID_UNICODE_HEX, "\"\\u012\"");
    TEST_ERROR(MILO_PARSE_INVALID_UNICODE_HEX, "\"\\u/000\"");
    TEST_ERROR(MILO_PARSE_INVALID_UNICODE_HEX, "\"\\uG000\"");
    TEST_ERROR(MILO_PARSE_INVALID_UNICODE_HEX, "\"\\u0/00\"");
    TEST_ERROR(MILO_PARSE_INVALID_UNICODE_HEX, "\"\\u0G00\"");
    TEST_ERROR(MILO_PARSE_INVALID_UNICODE_HEX, "\"\\u0/00\"");
    TEST_ERROR(MILO_PARSE_INVALID_UNICODE_HEX, "\"\\u00G0\"");
    TEST_ERROR(MILO_PARSE_INVALID_UNICODE_HEX, "\"\\u000/\"");
    TEST_ERROR(MILO_PARSE_INVALID_UNICODE_HEX, "\"\\u000G\"");
}